

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_ctx.cc
# Opt level: O2

int EVP_PKEY_CTX_ctrl(EVP_PKEY_CTX *ctx,int keytype,int optype,int cmd,int p1,void *p2)

{
  int *piVar1;
  int iVar2;
  undefined8 in_RAX;
  int line;
  
  if (((ctx == (EVP_PKEY_CTX *)0x0) || (piVar1 = *(int **)ctx, piVar1 == (int *)0x0)) ||
     (*(code **)(piVar1 + 0x1c) == (code *)0x0)) {
    iVar2 = 0x65;
    line = 0x94;
  }
  else if ((keytype == -1) || (*piVar1 == keytype)) {
    if (*(uint *)(ctx + 0x20) == 0) {
      iVar2 = 0x7b;
      line = 0x9d;
    }
    else {
      if ((*(uint *)(ctx + 0x20) & optype) != 0) {
        iVar2 = (**(code **)(piVar1 + 0x1c))(ctx,cmd,p1,p2,in_RAX);
        return iVar2;
      }
      iVar2 = 0x72;
      line = 0xa2;
    }
  }
  else {
    iVar2 = 0x7d;
    line = 0x98;
  }
  ERR_put_error(6,0,iVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_ctx.cc"
                ,line);
  return 0;
}

Assistant:

int EVP_PKEY_CTX_ctrl(EVP_PKEY_CTX *ctx, int keytype, int optype, int cmd,
                      int p1, void *p2) {
  if (!ctx || !ctx->pmeth || !ctx->pmeth->ctrl) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_COMMAND_NOT_SUPPORTED);
    return 0;
  }
  if (keytype != -1 && ctx->pmeth->pkey_id != keytype) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_OPERATION_NOT_SUPPORTED_FOR_THIS_KEYTYPE);
    return 0;
  }

  if (ctx->operation == EVP_PKEY_OP_UNDEFINED) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_NO_OPERATION_SET);
    return 0;
  }

  if (optype != -1 && !(ctx->operation & optype)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_OPERATION);
    return 0;
  }

  return ctx->pmeth->ctrl(ctx, cmd, p1, p2);
}